

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_dec.c
# Opt level: O2

int WebPGetInfo(uint8_t *data,size_t data_size,int *width,int *height)

{
  VP8StatusCode VVar1;
  int iVar2;
  WebPBitstreamFeatures features;
  
  VVar1 = GetFeatures(data,data_size,&features);
  iVar2 = 0;
  if (VVar1 == VP8_STATUS_OK) {
    if (width != (int *)0x0) {
      *width = features.width;
    }
    iVar2 = 1;
    if (height != (int *)0x0) {
      *height = features.height;
    }
  }
  return iVar2;
}

Assistant:

int WebPGetInfo(const uint8_t* data, size_t data_size,
                int* width, int* height) {
  WebPBitstreamFeatures features;

  if (GetFeatures(data, data_size, &features) != VP8_STATUS_OK) {
    return 0;
  }

  if (width != NULL) {
    *width  = features.width;
  }
  if (height != NULL) {
    *height = features.height;
  }

  return 1;
}